

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall
helics::LogManager::addLoggingCLI(LogManager *this,shared_ptr<helics::helicsCLI11App> *app)

{
  element_type *this_00;
  App *this_01;
  Option *pOVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  string_view fmt;
  allocator<char> local_7ad;
  allocator<char> local_7ac;
  allocator<char> local_7ab;
  allocator<char> local_7aa;
  allocator<char> local_7a9;
  _Any_data local_7a8;
  code *local_798;
  code *local_790;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_788;
  string local_780;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_760;
  _Any_data local_758;
  code *local_748;
  code *local_740;
  _Any_data local_738;
  code *local_728;
  code *local_720;
  string local_718;
  _Any_data local_6f8 [7];
  Validator local_688;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  filter_fn_t local_440;
  filter_fn_t local_420;
  filter_fn_t local_400;
  filter_fn_t local_3e0;
  filter_fn_t local_3c0;
  filter_fn_t local_3a0;
  filter_fn_t local_380;
  filter_fn_t local_360;
  filter_fn_t local_340;
  filter_fn_t local_320;
  filter_fn_t local_300;
  filter_fn_t local_2e0;
  Validator local_2c0;
  Validator local_258;
  Validator local_1f0;
  Validator local_188;
  Validator local_120;
  Validator local_b8;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = (app->super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"logging",(allocator<char> *)local_6f8[0]._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"Options related to file and message logging",
             (allocator<char> *)&local_688);
  this_01 = &CLI::App::add_option_group<CLI::Option_group>
                       (&this_00->super_App,&local_460,&local_480)->super_App;
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"--force_logging_flush",
             (allocator<char> *)local_6f8[0]._M_pod_data);
  local_738._8_8_ = 0;
  local_720 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:161:9)>
              ::_M_invoke;
  local_728 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:161:9)>
              ::_M_manager;
  local_738._M_unused._M_object = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"flush the log after every message",(allocator<char> *)&local_688)
  ;
  CLI::App::add_flag_function(this_01,&local_4a0,(function<void_(long)> *)&local_738,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_738);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"--logfile",(allocator<char> *)local_6f8[0]._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"the file to log the messages to",(allocator<char> *)&local_688);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_01,&local_4e0,&this->logFile,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"--loglevel",&local_7ab);
  local_7a8._8_8_ = 0;
  local_790 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:171:13)>
              ::_M_invoke;
  local_798 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:171:13)>
              ::_M_manager;
  local_7a8._M_unused._M_object = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,
             "the level at which to log, the higher this is set the more gets logged; set to \"no_print\" for no logging"
             ,&local_7ac);
  pOVar1 = CLI::App::add_option_function<int>
                     (this_01,&local_520,(function<void_(const_int_&)> *)&local_7a8,&local_540);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"HELICS_BROKER_LOG_LEVEL",&local_7ad);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar1->envname_,&local_560);
  local_2e0.super__Function_base._M_functor._8_8_ = 0;
  local_760 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_2e0.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_2e0._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_2e0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_300.super__Function_base._M_functor._8_8_ = 0;
  local_300.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_300._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_300.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)local_6f8,&local_760,&local_2e0,&local_300);
  CLI::Validator::Validator(&local_b8,(Validator *)local_6f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"",&local_7a9);
  pOVar1 = CLI::Option::transform(pOVar1,&local_b8,&local_780);
  local_320.super__Function_base._M_functor._8_8_ = 0;
  local_788 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_320.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_320._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_340.super__Function_base._M_functor._8_8_ = 0;
  local_320.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_340.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_340._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_340.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_688,&local_788,&local_320,&local_340);
  CLI::Validator::Validator(&local_120,&local_688);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"",&local_7aa);
  CLI::Option::transform(pOVar1,&local_120,&local_718);
  std::__cxx11::string::~string((string *)&local_718);
  CLI::Validator::~Validator(&local_120);
  CLI::Validator::~Validator(&local_688);
  CLI::std::_Function_base::~_Function_base(&local_340.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_320.super__Function_base);
  std::__cxx11::string::~string((string *)&local_780);
  CLI::Validator::~Validator(&local_b8);
  CLI::Validator::~Validator((Validator *)local_6f8);
  CLI::std::_Function_base::~_Function_base(&local_300.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_2e0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"--fileloglevel",(allocator<char> *)&local_788);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"the level at which messages get sent to the file",&local_7ab);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (this_01,&local_580,&this->fileLogLevel,&local_5a0);
  local_360.super__Function_base._M_functor._8_8_ = 0;
  local_718._M_dataplus._M_p = gLogLevelMap_abi_cxx11_;
  local_360.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_360._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_380.super__Function_base._M_functor._8_8_ = 0;
  local_360.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_380.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_380._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_380.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)local_6f8,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              **)&local_718,&local_360,&local_380);
  CLI::Validator::Validator(&local_188,(Validator *)local_6f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_7a8._M_pod_data,"",&local_7ac);
  pOVar1 = CLI::Option::transform(pOVar1,&local_188,(string *)&local_7a8);
  local_3a0.super__Function_base._M_functor._8_8_ = 0;
  local_760 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_3a0.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_3a0._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_3c0.super__Function_base._M_functor._8_8_ = 0;
  local_3a0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_3c0.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_3c0._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_3c0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_688,&local_760,&local_3a0,&local_3c0);
  CLI::Validator::Validator(&local_1f0,&local_688);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"",&local_7ad);
  CLI::Option::transform(pOVar1,&local_1f0,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  CLI::Validator::~Validator(&local_1f0);
  CLI::Validator::~Validator(&local_688);
  CLI::std::_Function_base::~_Function_base(&local_3c0.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_3a0.super__Function_base);
  std::__cxx11::string::~string((string *)local_7a8._M_pod_data);
  CLI::Validator::~Validator(&local_188);
  CLI::Validator::~Validator((Validator *)local_6f8);
  CLI::std::_Function_base::~_Function_base(&local_380.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_360.super__Function_base);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"--consoleloglevel",(allocator<char> *)&local_788);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"the level at which messages get sent to the file",&local_7ab);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (this_01,&local_5c0,&this->consoleLogLevel,&local_5e0);
  local_3e0.super__Function_base._M_functor._8_8_ = 0;
  local_718._M_dataplus._M_p = gLogLevelMap_abi_cxx11_;
  local_3e0.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_3e0._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_400.super__Function_base._M_functor._8_8_ = 0;
  local_3e0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_400.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_400._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_400.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)local_6f8,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              **)&local_718,&local_3e0,&local_400);
  CLI::Validator::Validator(&local_258,(Validator *)local_6f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_7a8._M_pod_data,"",&local_7ac);
  pOVar1 = CLI::Option::transform(pOVar1,&local_258,(string *)&local_7a8);
  local_420.super__Function_base._M_functor._8_8_ = 0;
  local_760 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_420.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_420._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_440.super__Function_base._M_functor._8_8_ = 0;
  local_420.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_440.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_440._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_440.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_688,&local_760,&local_420,&local_440);
  CLI::Validator::Validator(&local_2c0,&local_688);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"",&local_7ad);
  CLI::Option::transform(pOVar1,&local_2c0,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  CLI::Validator::~Validator(&local_2c0);
  CLI::Validator::~Validator(&local_688);
  CLI::std::_Function_base::~_Function_base(&local_440.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_420.super__Function_base);
  std::__cxx11::string::~string((string *)local_7a8._M_pod_data);
  CLI::Validator::~Validator(&local_258);
  CLI::Validator::~Validator((Validator *)local_6f8);
  CLI::std::_Function_base::~_Function_base(&local_400.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_3e0.super__Function_base);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  local_6f8[0]._M_unused._M_member_pointer = 10;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_6f8;
  fmt.size_ = 4;
  fmt.data_ = (char *)0x11;
  ::fmt::v11::vformat_abi_cxx11_(&local_600,(v11 *)"--logbuffer{{{}}}",fmt,args);
  local_758._8_8_ = 0;
  local_740 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:197:13)>
              ::_M_invoke;
  local_748 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:197:13)>
              ::_M_manager;
  local_758._M_unused._M_object = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,
             "optionally specify the size of the circular buffer for storing log messages for later retrieval "
             ,(allocator<char> *)local_6f8[0]._M_pod_data);
  pOVar1 = CLI::App::add_flag_function
                     (this_01,(string *)&local_600,(function<void_(long)> *)&local_758,&local_620);
  pOVar1->expected_min_ = 0;
  pOVar1->expected_max_ = 1;
  CLI::Option::multi_option_policy(pOVar1,TakeLast);
  std::__cxx11::string::~string((string *)&local_620);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_758);
  std::__cxx11::string::~string((string *)&local_600);
  local_50._8_8_ = 0;
  local_38 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:201:29)>
             ::_M_invoke;
  local_40 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:201:29)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  CLI::App::callback(this_01,(function<void_()> *)&local_50);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return;
}

Assistant:

void LogManager::addLoggingCLI(std::shared_ptr<helicsCLI11App>& app)
{
    auto* logging_group =
        app->add_option_group("logging", "Options related to file and message logging");
    logging_group->add_flag_function(
        "--force_logging_flush",
        [this](int64_t val) {
            if (val > 0) {
                forceLoggingFlush = true;
            }
        },
        "flush the log after every message");
    logging_group->add_option("--logfile", logFile, "the file to log the messages to");
    logging_group
        ->add_option_function<int>(
            "--loglevel",
            [this](int val) { setLogLevel(val); },
            "the level at which to log, the higher this is set the more gets logged; set to \"no_print\" for no logging")
        ->envname("HELICS_BROKER_LOG_LEVEL")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));

    logging_group
        ->add_option("--fileloglevel",
                     fileLogLevel,
                     "the level at which messages get sent to the file")
        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_option("--consoleloglevel",
                     consoleLogLevel,
                     "the level at which messages get sent to the file")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_flag_function(
            fmt::format("--logbuffer{{{}}}", LogBuffer::cDefaultBufferSize),
            [this](std::int64_t val) { mLogBuffer.resize(val); },
            "optionally specify the size of the circular buffer for storing log messages for later retrieval ")
        ->expected(0, 1)
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast);
    logging_group->callback([this]() { updateMaxLogLevel(); });
}